

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O1

void __thiscall Js::ProbeContainer::Initialize(ProbeContainer *this,ScriptContext *pScriptContext)

{
  ArenaAllocator *alloc;
  ProbeList *pPVar1;
  List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *addr;
  
  if (this->diagProbeList != (ProbeList *)0x0) {
    return;
  }
  alloc = ScriptContext::AllocatorForDiagnostics(pScriptContext);
  pPVar1 = (ProbeList *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
  (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).alloc = alloc;
  (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014fa7f0;
  pPVar1->length = 0;
  pPVar1->increment = 4;
  this->diagProbeList = pPVar1;
  pPVar1 = (ProbeList *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
  (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).alloc = alloc;
  (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014fa7f0;
  pPVar1->length = 0;
  pPVar1->increment = 4;
  this->pendingProbeList = pPVar1;
  this->pScriptContext = pScriptContext;
  this->debugManager = pScriptContext->threadContext->debugManager;
  addr = JsUtil::
         List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         ::New(pScriptContext->recycler,4);
  this->pinnedPropertyRecords = addr;
  ScriptContext::BindReference(this->pScriptContext,addr);
  return;
}

Assistant:

void ProbeContainer::Initialize(ScriptContext* pScriptContext)
    {
        if (!diagProbeList)
        {
            ArenaAllocator* global = pScriptContext->AllocatorForDiagnostics();

            diagProbeList = ProbeList::New(global);

            pendingProbeList = ProbeList::New(global);

            this->pScriptContext = pScriptContext;
            this->debugManager = this->pScriptContext->GetThreadContext()->GetDebugManager();
            this->pinnedPropertyRecords = JsUtil::List<const Js::PropertyRecord*>::New(this->pScriptContext->GetRecycler());
            this->pScriptContext->BindReference((void *)this->pinnedPropertyRecords);
        }
    }